

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall
pbrt::TriangleMesh::getPrimBounds(box3f *__return_storage_ptr__,TriangleMesh *this,size_t primID)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pvVar5;
  pointer pvVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  auVar8 = _DAT_0014c350;
  uVar7 = DAT_0014c350;
  (__return_storage_ptr__->upper).y = (float)(int)uVar7;
  (__return_storage_ptr__->upper).z = (float)(int)((ulong)uVar7 >> 0x20);
  pvVar5 = (this->vertex).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (this->index).super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2._0_4_ = pvVar5[pvVar6[primID].x].x;
  uVar2._4_4_ = pvVar5[pvVar6[primID].x].y;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar2;
  auVar11 = minps(auVar11,_DAT_0014c360);
  fVar14 = pvVar5[pvVar6[primID].x].z;
  fVar13 = fVar14;
  if (3.4028235e+38 <= fVar14) {
    fVar13 = 3.4028235e+38;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar11._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar13;
  if (fVar14 <= -3.4028235e+38) {
    fVar14 = -3.4028235e+38;
  }
  auVar9 = maxps(auVar9,auVar8);
  (__return_storage_ptr__->upper).x = (float)(int)auVar9._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar14;
  uVar3._0_4_ = pvVar5[pvVar6[primID].y].x;
  uVar3._4_4_ = pvVar5[pvVar6[primID].y].y;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar3;
  auVar11 = minps(auVar15,auVar11);
  fVar1 = pvVar5[pvVar6[primID].y].z;
  fVar16 = fVar1;
  if (fVar13 <= fVar1) {
    fVar16 = fVar13;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar11._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar16;
  auVar8 = maxps(auVar8,auVar9);
  if (fVar1 <= fVar14) {
    fVar1 = fVar14;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar8._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar8._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar1;
  uVar4._0_4_ = pvVar5[pvVar6[primID].z].x;
  uVar4._4_4_ = pvVar5[pvVar6[primID].z].y;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar4;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar4;
  auVar9 = minps(auVar12,auVar11);
  fVar14 = pvVar5[pvVar6[primID].z].z;
  fVar13 = fVar14;
  if (fVar16 <= fVar14) {
    fVar13 = fVar16;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar9._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar13;
  auVar8 = maxps(auVar10,auVar8);
  if (fVar14 <= fVar1) {
    fVar14 = fVar1;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar8._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar8._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar14;
  return __return_storage_ptr__;
}

Assistant:

box3f TriangleMesh::getPrimBounds(const size_t primID) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(vertex[index[primID].x]);
    primBounds.extend(vertex[index[primID].y]);
    primBounds.extend(vertex[index[primID].z]);
    return primBounds;
  }